

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_rules.cpp
# Opt level: O0

int64_t duckdb::TargetTypeCost(LogicalType *type)

{
  LogicalTypeId LVar1;
  LogicalType *in_RDI;
  idx_t local_8;
  
  LVar1 = LogicalType::id(in_RDI);
  switch((LogicalType *)(ulong)(byte)(LVar1 - ANY)) {
  case (LogicalType *)0x0:
    local_8 = AnyType::GetCastScore((LogicalType *)(ulong)(byte)(LVar1 - ANY));
    break;
  default:
    local_8 = 0x6e;
    break;
  case (LogicalType *)0xa:
    local_8 = 0x66;
    break;
  case (LogicalType *)0xb:
    local_8 = 0x65;
    break;
  case (LogicalType *)0xe:
    local_8 = 0x7a;
    break;
  case (LogicalType *)0xf:
    local_8 = 0x79;
    break;
  case (LogicalType *)0x10:
    local_8 = 0x78;
    break;
  case (LogicalType *)0x11:
    local_8 = 0x77;
    break;
  case (LogicalType *)0x12:
    local_8 = 0x69;
    break;
  case (LogicalType *)0x14:
    local_8 = 0x68;
    break;
  case (LogicalType *)0x16:
    local_8 = 0x95;
    break;
  case (LogicalType *)0x1d:
    local_8 = 0x7b;
    break;
  case (LogicalType *)0x2f:
    local_8 = 0x67;
    break;
  case (LogicalType *)0x61:
  case (LogicalType *)0x62:
  case (LogicalType *)0x63:
  case (LogicalType *)0x68:
  case (LogicalType *)0x69:
    local_8 = 0xa0;
  }
  return local_8;
}

Assistant:

static int64_t TargetTypeCost(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BIGINT:
		return 101;
	case LogicalTypeId::INTEGER:
		return 102;
	case LogicalTypeId::HUGEINT:
		return 103;
	case LogicalTypeId::DOUBLE:
		return 104;
	case LogicalTypeId::DECIMAL:
		return 105;
	case LogicalTypeId::TIMESTAMP_NS:
		return 119;
	case LogicalTypeId::TIMESTAMP:
		return 120;
	case LogicalTypeId::TIMESTAMP_MS:
		return 121;
	case LogicalTypeId::TIMESTAMP_SEC:
		return 122;
	case LogicalTypeId::TIMESTAMP_TZ:
		return 123;
	case LogicalTypeId::VARCHAR:
		return 149;
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::MAP:
	case LogicalTypeId::LIST:
	case LogicalTypeId::UNION:
	case LogicalTypeId::ARRAY:
		return 160;
	case LogicalTypeId::ANY:
		return int64_t(AnyType::GetCastScore(type));
	default:
		return 110;
	}
}